

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cobs.h
# Opt level: O0

ByteSequence * cobs::cobs_decode(ByteSequence *__return_storage_ptr__,ByteSequence *input)

{
  bool bVar1;
  reference puVar2;
  bool local_a1;
  value_type local_79;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  uchar *local_70;
  uchar *local_68;
  uchar *local_60;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  const_iterator local_50;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  const_iterator previous_code_byte;
  const_iterator next_code_byte;
  ByteSequence *input_local;
  ByteSequence *output;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  previous_code_byte = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(input);
  local_30._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(input);
  while( true ) {
    local_38._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(input);
    bVar1 = __gnu_cxx::operator!=(&previous_code_byte,&local_38);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&previous_code_byte);
    std::
    advance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
              (&previous_code_byte,*puVar2);
    local_58._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            (__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_50,&local_58);
    local_60 = (uchar *)__gnu_cxx::
                        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+(&local_30,1);
    local_68 = previous_code_byte._M_current;
    local_70 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                        insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                   __return_storage_ptr__,local_50,
                                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    )local_60,previous_code_byte._M_current);
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_30);
    local_a1 = false;
    if (*puVar2 != 0xff) {
      local_78._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(input);
      local_a1 = __gnu_cxx::operator!=(&previous_code_byte,&local_78);
    }
    if (local_a1 != false) {
      local_79 = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,&local_79);
    }
    local_30._M_current = previous_code_byte._M_current;
  }
  return __return_storage_ptr__;
}

Assistant:

ByteSequence cobs_decode(const ByteSequence &input )
{
  ByteSequence output;

  auto next_code_byte = input.begin();
  auto previous_code_byte = input.begin();

  while(next_code_byte != input.end() )
  {
   
    std::advance(next_code_byte,*next_code_byte);

    output.insert(output.end(),previous_code_byte+1,next_code_byte);

    if(    *previous_code_byte != 0xFF
           && next_code_byte != input.end())
    {
      output.push_back(0); //restore zero byte only in case if code byte was not 0xFF
    }

    previous_code_byte = next_code_byte;



  }

  return(output);
}